

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_lpf2_get_heap_size(ma_lpf2_config *pConfig,size_t *pHeapSizeInBytes)

{
  ma_result mVar1;
  undefined4 *in_RDI;
  size_t *pHeapSizeInBytes_00;
  ma_biquad_config *pConfig_00;
  ma_biquad_config bqConfig_1;
  ma_biquad_config bqConfig;
  double a;
  double c;
  double s;
  double w;
  double q;
  undefined4 local_c8;
  undefined4 local_c4;
  double local_c0;
  double local_b8;
  undefined1 local_90 [72];
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  double local_28;
  undefined4 *local_20;
  double local_18;
  double local_10;
  double local_8;
  
  local_28 = *(double *)(in_RDI + 6);
  local_30 = (*(double *)(in_RDI + 4) * 6.283185307179586) / (double)(uint)in_RDI[2];
  local_20 = in_RDI;
  local_18 = local_30;
  local_38 = sin(local_30);
  local_10 = local_30;
  local_8 = 1.5707963267948966 - local_30;
  local_40 = sin(local_8);
  local_48 = local_38 / (local_28 * 2.0);
  local_c0 = (1.0 - local_40) / 2.0;
  local_b8 = 1.0 - local_40;
  pHeapSizeInBytes_00 = (size_t *)((1.0 - local_40) / 2.0);
  pConfig_00 = (ma_biquad_config *)(local_48 + 1.0);
  local_c8 = *local_20;
  local_c4 = local_20[1];
  memcpy(local_90,&local_c8,0x38);
  mVar1 = ma_biquad_get_heap_size(pConfig_00,pHeapSizeInBytes_00);
  return mVar1;
}

Assistant:

MA_API ma_result ma_lpf2_get_heap_size(const ma_lpf2_config* pConfig, size_t* pHeapSizeInBytes)
{
    ma_biquad_config bqConfig;
    bqConfig = ma_lpf2__get_biquad_config(pConfig);

    return ma_biquad_get_heap_size(&bqConfig, pHeapSizeInBytes);
}